

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_cd.cpp
# Opt level: O0

void __thiscall CDSong::CDSong(CDSong *this,int track,int id)

{
  bool bVar1;
  bool local_19;
  bool success;
  int id_local;
  int track_local;
  CDSong *this_local;
  
  MusInfo::MusInfo(&this->super_MusInfo);
  (this->super_MusInfo)._vptr_MusInfo = (_func_int **)&PTR__CDSong_00b65478;
  this->m_Inited = false;
  if (id == 0) {
    local_19 = CD_Init();
  }
  else {
    local_19 = CD_InitID(id,-1);
  }
  if ((local_19 != false) && ((track == 0 || (bVar1 = CD_CheckTrack(track), bVar1)))) {
    this->m_Inited = true;
    this->m_Track = track;
  }
  return;
}

Assistant:

CDSong::CDSong (int track, int id)
{
	bool success;

	m_Inited = false;

	if (id != 0)
	{
		success = CD_InitID (id);
	}
	else
	{
		success = CD_Init ();
	}

	if (success && (track == 0 || CD_CheckTrack (track)))
	{
		m_Inited = true;
		m_Track = track;
	}
}